

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs.c
# Opt level: O2

void fstat_cb(uv_fs_t *req)

{
  undefined8 uVar1;
  char *pcVar2;
  
  if (req->fs_type == UV_FS_FSTAT) {
    if (req->result == 0) {
      if (*(long *)((long)req->ptr + 0x38) == 0xd) {
        uv_fs_req_cleanup();
        fstat_cb_count = fstat_cb_count + 1;
        return;
      }
      pcVar2 = "s->st_size == sizeof(test_buf)";
      uVar1 = 0x152;
    }
    else {
      pcVar2 = "req->result == 0";
      uVar1 = 0x151;
    }
  }
  else {
    pcVar2 = "req->fs_type == UV_FS_FSTAT";
    uVar1 = 0x150;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
          ,uVar1,pcVar2);
  abort();
}

Assistant:

static void fstat_cb(uv_fs_t* req) {
  uv_stat_t* s = req->ptr;
  ASSERT(req->fs_type == UV_FS_FSTAT);
  ASSERT(req->result == 0);
  ASSERT(s->st_size == sizeof(test_buf));
  uv_fs_req_cleanup(req);
  fstat_cb_count++;
}